

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextodfwriter.cpp
# Opt level: O0

void __thiscall
QTextOdfWriter::writeFormats(QTextOdfWriter *this,QXmlStreamWriter *writer,QSet<int> *formats)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  QTextOdfWriter *in_RDX;
  QTextFormat *in_RSI;
  QXmlStreamWriter *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  int in_stack_00000014;
  QTextCharFormat *in_stack_00000018;
  QXmlStreamWriter *in_stack_00000020;
  QTextOdfWriter *in_stack_00000028;
  int formatIndex;
  QSet<int> *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QTextFormat> allStyles;
  QTextFormat textFormat;
  int in_stack_0000072c;
  QTextFormat *in_stack_fffffffffffffe88;
  QTextFormat *in_stack_fffffffffffffe90;
  QTextFormat *pQVar5;
  QString *in_stack_fffffffffffffe98;
  QAnyStringView *in_stack_fffffffffffffea0;
  QSet<int> *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffee0;
  int iVar6;
  QTextOdfWriter *this_00;
  QTextFormat *format;
  QXmlStreamWriter *writer_00;
  QTextOdfWriter *this_01;
  storage_type *local_c0;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  QXmlStreamWriter *in_stack_ffffffffffffff50;
  QTextOdfWriter *in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff6c;
  QTextListFormat *in_stack_ffffffffffffff70;
  QXmlStreamWriter *in_stack_ffffffffffffff78;
  QTextOdfWriter *in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffffb4;
  QTextBlockFormat *in_stack_ffffffffffffffb8;
  QXmlStreamWriter *in_stack_ffffffffffffffc0;
  QTextOdfWriter *in_stack_ffffffffffffffc8;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = in_RSI;
  writer_00 = in_RDI;
  QAnyStringView::QAnyStringView(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  QByteArrayView::QByteArrayView<17ul>
            ((QByteArrayView *)in_stack_fffffffffffffea0,(char (*) [17])in_stack_fffffffffffffe98);
  QVar4.m_data = local_c0;
  QVar4.m_size = (qsizetype)&stack0xffffffffffffff50;
  QString::fromLatin1(QVar4);
  QAnyStringView::QAnyStringView(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  QXmlStreamWriter::writeStartElement
            ((QAnyStringView *)in_RSI,(QAnyStringView *)in_stack_ffffffffffffff78);
  QString::~QString((QString *)0x9ec959);
  QTextDocument::allFormats((QTextDocument *)in_stack_fffffffffffffe98);
  this_00 = in_RDX;
  QSet<int>::begin(in_stack_fffffffffffffea8);
  this_01 = (QTextOdfWriter *)&DAT_aaaaaaaaaaaaaaaa;
  QSet<int>::end(in_stack_fffffffffffffea8);
  while (bVar1 = QSet<int>::const_iterator::operator!=
                           ((const_iterator *)in_stack_fffffffffffffe90,
                            (const_iterator *)in_stack_fffffffffffffe88), bVar1) {
    piVar3 = QSet<int>::const_iterator::operator*((const_iterator *)0x9eca43);
    iVar6 = *piVar3;
    local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QList<QTextFormat>::at
              ((QList<QTextFormat> *)in_stack_fffffffffffffe90,(qsizetype)in_stack_fffffffffffffe88)
    ;
    QTextFormat::QTextFormat(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    iVar2 = QTextFormat::type((QTextFormat *)local_18);
    switch(iVar2) {
    case 1:
      QTextFormat::toBlockFormat(in_stack_fffffffffffffe88);
      writeBlockFormat(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8
                       ,in_stack_ffffffffffffffb4);
      QTextBlockFormat::~QTextBlockFormat((QTextBlockFormat *)0x9ecba8);
      break;
    case 2:
      bVar1 = QTextFormat::isTableCellFormat(in_stack_fffffffffffffe90);
      if (bVar1) {
        QTextFormat::toTableCellFormat(in_stack_fffffffffffffe88);
        writeTableCellFormat
                  (this_00,(QXmlStreamWriter *)in_RDX,
                   (QTextTableCellFormat *)CONCAT44(iVar6,in_stack_fffffffffffffee0),
                   in_stack_ffffffffffffff4c,(QList<QTextFormat> *)in_RDI);
        QTextTableCellFormat::~QTextTableCellFormat((QTextTableCellFormat *)0x9ecb13);
      }
      else {
        QTextFormat::toCharFormat(in_stack_fffffffffffffe88);
        writeCharacterFormat
                  (in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000014);
        QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x9ecb5c);
      }
      break;
    case 3:
      QTextFormat::toListFormat(in_stack_fffffffffffffe88);
      writeListFormat(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                      in_stack_ffffffffffffff6c);
      QTextListFormat::~QTextListFormat((QTextListFormat *)0x9ecbf4);
      break;
    case 5:
      bVar1 = QTextFormat::isTableFormat(in_stack_fffffffffffffe90);
      if (bVar1) {
        QTextFormat::toTableFormat(in_stack_fffffffffffffe88);
        writeTableFormat(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                         (QTextTableFormat *)
                         CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                         in_stack_0000072c);
        QTextTableFormat::~QTextTableFormat((QTextTableFormat *)0x9ecc53);
      }
      else {
        format = pQVar5;
        QTextFormat::toFrameFormat(in_stack_fffffffffffffe88);
        writeFrameFormat(this_01,writer_00,(QTextFrameFormat *)format,(int)((ulong)this_00 >> 0x20))
        ;
        QTextFrameFormat::~QTextFrameFormat((QTextFrameFormat *)0x9ecc9c);
        in_stack_fffffffffffffe90 = pQVar5;
        pQVar5 = format;
      }
    }
    QTextFormat::~QTextFormat((QTextFormat *)0x9eccab);
    QSet<int>::const_iterator::operator++((const_iterator *)in_stack_fffffffffffffe90);
  }
  QXmlStreamWriter::writeEndElement();
  QList<QTextFormat>::~QList((QList<QTextFormat> *)0x9eccd4);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextOdfWriter::writeFormats(QXmlStreamWriter &writer, const QSet<int> &formats) const
{
    writer.writeStartElement(officeNS, QString::fromLatin1("automatic-styles"));
    QList<QTextFormat> allStyles = m_document->allFormats();
    for (int formatIndex : formats) {
        QTextFormat textFormat = allStyles.at(formatIndex);
        switch (textFormat.type()) {
        case QTextFormat::CharFormat:
            if (textFormat.isTableCellFormat())
                writeTableCellFormat(writer, textFormat.toTableCellFormat(), formatIndex, allStyles);
            else
                writeCharacterFormat(writer, textFormat.toCharFormat(), formatIndex);
            break;
        case QTextFormat::BlockFormat:
            writeBlockFormat(writer, textFormat.toBlockFormat(), formatIndex);
            break;
        case QTextFormat::ListFormat:
            writeListFormat(writer, textFormat.toListFormat(), formatIndex);
            break;
        case QTextFormat::FrameFormat:
            if (textFormat.isTableFormat())
                writeTableFormat(writer, textFormat.toTableFormat(), formatIndex);
            else
                writeFrameFormat(writer, textFormat.toFrameFormat(), formatIndex);
            break;
        }
    }

    writer.writeEndElement(); // automatic-styles
}